

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

void cfd::core::MergePsbtInputs(wally_psbt *psbt,wally_psbt *psbt_dest,bool ignore_duplicate_error)

{
  uchar *buffer;
  wally_tx_input *pwVar1;
  unsigned_long uVar2;
  ulong uVar3;
  pointer puVar4;
  int iVar5;
  CfdException *pCVar6;
  pointer puVar7;
  long lVar8;
  wally_tx_input *pwVar9;
  long lVar10;
  size_t sVar11;
  bool bVar12;
  ulong local_118;
  int ret;
  undefined1 local_108 [32];
  string item_key;
  Txid txid;
  vector<unsigned_long,_std::allocator<unsigned_long>_> append_indexes;
  string local_70;
  string local_50;
  
  append_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  append_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  append_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118 = 0;
  do {
    puVar4 = append_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (psbt_dest->num_inputs <= local_118) {
      puVar7 = append_indexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        if (puVar7 == puVar4) {
          ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    (&append_indexes.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
          return;
        }
        uVar2 = *puVar7;
        uVar3 = psbt->num_inputs;
        ret = wally_psbt_add_input_at(psbt,(uint32_t)uVar3,1,psbt_dest->tx->inputs + uVar2);
        if (ret != 0) break;
        pwVar9 = psbt_dest->tx->inputs + uVar2;
        ByteData::ByteData((ByteData *)local_108,pwVar9->txhash,0x20);
        ByteData256::ByteData256((ByteData256 *)&item_key,(ByteData *)local_108);
        Txid::Txid(&txid,(ByteData256 *)&item_key);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&item_key);
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_108);
        Txid::GetHex_abi_cxx11_(&local_70,&txid);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,&local_70,",");
        ::std::__cxx11::to_string(&local_50,pwVar9->index);
        ::std::operator+(&item_key,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,&local_50);
        ::std::__cxx11::string::~string((string *)&local_50);
        ::std::__cxx11::string::~string((string *)local_108);
        ::std::__cxx11::string::~string((string *)&local_70);
        MergePsbtInputItem(psbt->inputs + (uVar3 & 0xffffffff),psbt_dest->inputs + uVar2,
                           ignore_duplicate_error,&item_key);
        ::std::__cxx11::string::~string((string *)&item_key);
        Txid::~Txid(&txid);
        puVar7 = puVar7 + 1;
      }
      txid._vptr_Txid = (_func_int **)0x4f1aab;
      txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0x27f;
      txid.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = "MergePsbtInputs";
      logger::warn<int&>((CfdSourceLocation *)&txid,"wally_psbt_add_input_at NG[{}]",&ret);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&txid,"psbt add global unkonwns error.",(allocator *)&item_key);
      CfdException::CfdException(pCVar6,kCfdMemoryFullError,(string *)&txid);
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    pwVar9 = psbt_dest->tx->inputs + local_118;
    sVar11 = psbt->num_inputs;
    lVar10 = 0;
    lVar8 = 0;
    while (bVar12 = sVar11 != 0, sVar11 = sVar11 - 1, bVar12) {
      pwVar1 = psbt->tx->inputs;
      if (*(uint32_t *)(pwVar1->txhash + lVar10 + 0x20) == pwVar9->index) {
        buffer = pwVar1->txhash + lVar10;
        iVar5 = bcmp(buffer,pwVar9,0x20);
        if (iVar5 == 0) {
          ByteData::ByteData((ByteData *)local_108,buffer,0x20);
          ByteData256::ByteData256((ByteData256 *)&item_key,(ByteData *)local_108);
          Txid::Txid(&txid,(ByteData256 *)&item_key);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&item_key);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_108);
          Txid::GetHex_abi_cxx11_(&local_70,&txid);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_108,&local_70,",");
          ::std::__cxx11::to_string(&local_50,*(uint *)(buffer + 0x20));
          ::std::operator+(&item_key,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_108,&local_50);
          ::std::__cxx11::string::~string((string *)&local_50);
          ::std::__cxx11::string::~string((string *)local_108);
          ::std::__cxx11::string::~string((string *)&local_70);
          if (*(uint32_t *)(pwVar1->blinding_nonce + lVar10 + -0x1d) != pwVar9->sequence &&
              !ignore_duplicate_error) {
            local_108._0_8_ = "cfdcore_psbt.cpp";
            local_108._8_4_ = 0x26b;
            local_108._16_8_ = "MergePsbtInputs";
            logger::warn<std::__cxx11::string&>
                      ((CfdSourceLocation *)local_108,"psbt sequence duplicate. [{}]",&item_key);
            pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
            ::std::__cxx11::string::string
                      ((string *)local_108,"psbt sequence duplicate error.",(allocator *)&local_70);
            CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)local_108);
            __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
          }
          MergePsbtInputItem((wally_psbt_input *)((long)psbt->inputs - lVar8),
                             psbt_dest->inputs + local_118,ignore_duplicate_error,&item_key);
          ::std::__cxx11::string::~string((string *)&item_key);
          Txid::~Txid(&txid);
          goto LAB_002daedf;
        }
      }
      lVar8 = lVar8 + -0x110;
      lVar10 = lVar10 + 0xd0;
    }
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&append_indexes,&local_118);
LAB_002daedf:
    local_118 = local_118 + 1;
  } while( true );
}

Assistant:

void MergePsbtInputs(
    struct wally_psbt *psbt, const struct wally_psbt *psbt_dest,
    bool ignore_duplicate_error) {
  bool is_find;
  int ret;
  std::vector<size_t> append_indexes;
  for (size_t dst_idx = 0; dst_idx < psbt_dest->num_inputs; ++dst_idx) {
    auto dest_txin = &psbt_dest->tx->inputs[dst_idx];
    is_find = false;
    for (size_t src_idx = 0; src_idx < psbt->num_inputs; ++src_idx) {
      auto src_txin = &psbt->tx->inputs[src_idx];
      if ((src_txin->index == dest_txin->index) &&
          (memcmp(
               src_txin->txhash, dest_txin->txhash,
               sizeof(src_txin->txhash)) == 0)) {
        is_find = true;
        Txid txid(ByteData256(ByteData(
            src_txin->txhash,
            static_cast<uint32_t>(sizeof(src_txin->txhash)))));
        std::string item_key =
            txid.GetHex() + "," + std::to_string(src_txin->index);
        if (src_txin->sequence == dest_txin->sequence) {
          // do nothing
        } else if (ignore_duplicate_error) {
          // do nothing
        } else {
          warn(CFD_LOG_SOURCE, "psbt sequence duplicate. [{}]", item_key);
          throw CfdException(
              kCfdIllegalArgumentError, "psbt sequence duplicate error.");
        }
        MergePsbtInputItem(
            &psbt->inputs[src_idx], &psbt_dest->inputs[dst_idx],
            ignore_duplicate_error, item_key);
        break;
      }
    }
    if (!is_find) append_indexes.push_back(dst_idx);
  }

  uint32_t index;
  for (auto dst_idx : append_indexes) {
    index = static_cast<uint32_t>(psbt->num_inputs);
    ret = wally_psbt_add_input_at(
        psbt, index, WALLY_PSBT_FLAG_NON_FINAL,
        &psbt_dest->tx->inputs[dst_idx]);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_psbt_add_input_at NG[{}]", ret);
      throw CfdException(
          kCfdMemoryFullError, "psbt add global unkonwns error.");
    }
    auto dest_txin = &psbt_dest->tx->inputs[dst_idx];
    Txid txid(ByteData256(ByteData(
        dest_txin->txhash, static_cast<uint32_t>(sizeof(dest_txin->txhash)))));
    std::string item_key =
        txid.GetHex() + "," + std::to_string(dest_txin->index);
    MergePsbtInputItem(
        &psbt->inputs[index], &psbt_dest->inputs[dst_idx],
        ignore_duplicate_error, item_key);
  }
}